

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  int iVar1;
  char *__dest;
  undefined1 *puVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ptrdiff_t _Num;
  size_t __n;
  char_type buffer [13];
  undefined1 auStack_26 [14];
  
  iVar1 = *(int *)(this + 4);
  __n = (size_t)iVar1;
  if ((long)__n < 0) {
    __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x3dd,
                  "Iterator fmt::internal::format_decimal(Iterator, UInt, int, ThousandsSep) [OutChar = char, UInt = unsigned int, Iterator = char *, ThousandsSep = fmt::internal::add_thousands_sep<char>]"
                 );
  }
  __dest = *it;
  uVar6 = (ulong)*(uint *)this;
  puVar2 = auStack_26 + __n + 1;
  if (uVar6 < 100) {
    if (*(uint *)this < 10) goto LAB_0018d06b;
    uVar7 = uVar6 * 2;
    auStack_26[__n] = internal::basic_data<void>::DIGITS[uVar6 * 2 + 1];
LAB_0018d081:
    puVar2 = puVar2 + -1;
  }
  else {
    iVar8 = 0;
    do {
      uVar7 = uVar6;
      uVar4 = (uint)uVar7;
      uVar6 = uVar7 / 100;
      iVar5 = (int)(uVar7 / 100);
      uVar9 = (ulong)((uVar4 + iVar5 * -100) * 2);
      puVar2[-1] = internal::basic_data<void>::DIGITS[uVar9 + 1];
      if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(num_writer *)(puVar2 + -2) = this[8];
        puVar2[-3] = internal::basic_data<void>::DIGITS[uVar9];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar10 = -4;
          goto LAB_0018d01c;
        }
        puVar2 = puVar2 + -3;
      }
      else {
        puVar2[-2] = internal::basic_data<void>::DIGITS[uVar9];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar10 = -3;
LAB_0018d01c:
          *(num_writer *)(puVar2 + lVar10) = this[8];
          puVar2 = puVar2 + lVar10;
        }
        else {
          puVar2 = puVar2 + -2;
        }
      }
      iVar8 = iVar8 + 2;
    } while (9999 < uVar4);
    if (uVar4 < 1000) {
LAB_0018d06b:
      bVar3 = (byte)uVar6 | 0x30;
      goto LAB_0018d090;
    }
    uVar7 = (ulong)(uint)(iVar5 + (int)(uVar7 / 100));
    puVar2[-1] = internal::basic_data<void>::DIGITS[uVar7 + 1];
    if (0x55555555 < iVar8 * -0x55555555 + 0xaaaaaaabU) goto LAB_0018d081;
    *(num_writer *)(puVar2 + -2) = this[8];
    puVar2 = puVar2 + -2;
  }
  bVar3 = internal::basic_data<void>::DIGITS[uVar7 & 0xffffffff];
LAB_0018d090:
  puVar2[-1] = bVar3;
  if (iVar1 != 0) {
    memcpy(__dest,auStack_26 + 1,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }